

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall QDockWidgetGroupLayout::setGeometry(QDockWidgetGroupLayout *this,QRect *r)

{
  QDockAreaLayoutInfo *this_00;
  QWidgetResizeHandler *this_01;
  Representation RVar1;
  Representation RVar2;
  Representation RVar3;
  bool bVar4;
  int xp1;
  QWidget *parent;
  QRect QVar5;
  
  QDockWidgetGroupWindow::destroyOrHideIfEmpty
            (*(QDockWidgetGroupWindow **)(*(long *)&(this->super_QLayout).field_0x8 + 0x10));
  this_00 = &this->layoutState;
  bVar4 = QDockAreaLayoutInfo::isEmpty(this_00);
  if (bVar4) {
    return;
  }
  xp1 = frameWidth(this);
  parent = QLayout::parentWidget(&this->super_QLayout);
  QDockAreaLayoutInfo::reparentWidgets(this_00,parent);
  QVar5 = QRect::adjusted(r,xp1,xp1,-xp1,-xp1);
  (this->layoutState).rect = QVar5;
  QDockAreaLayoutInfo::fitItems(this_00);
  QDockAreaLayoutInfo::apply(this_00,false);
  if (((this->savedState).rect.x1.m_i <= (this->savedState).rect.x2.m_i) &&
     ((this->savedState).rect.y1.m_i <= (this->savedState).rect.y2.m_i)) {
    RVar1.m_i = (this->layoutState).rect.y1.m_i;
    RVar2.m_i = (this->layoutState).rect.x2.m_i;
    RVar3.m_i = (this->layoutState).rect.y2.m_i;
    (this->savedState).rect.x1 = (Representation)(this->layoutState).rect.x1.m_i;
    (this->savedState).rect.y1 = (Representation)RVar1.m_i;
    (this->savedState).rect.x2 = (Representation)RVar2.m_i;
    (this->savedState).rect.y2 = (Representation)RVar3.m_i;
  }
  this_01 = this->resizer;
  bVar4 = nativeWindowDeco(this);
  QWidgetResizeHandler::setEnabled((QWidgetResizeHandler *)this_01,!bVar4);
  return;
}

Assistant:

void setGeometry(const QRect&r) override
    {
        groupWindow()->destroyOrHideIfEmpty();
        QDockAreaLayoutInfo *li = dockAreaLayoutInfo();
        if (li->isEmpty())
            return;
        int fw = frameWidth();
#if QT_CONFIG(tabbar)
        li->reparentWidgets(parentWidget());
#endif
        li->rect = r.adjusted(fw, fw, -fw, -fw);
        li->fitItems();
        li->apply(false);
        if (savedState.rect.isValid())
            savedState.rect = li->rect;
        resizer->setEnabled(!nativeWindowDeco());
    }